

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

Vector3 * __thiscall
iDynTree::KinDynComputations::getCenterOfMassVelocity
          (Vector3 *__return_storage_ptr__,KinDynComputations *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  SpatialMomentum m_totalMomentum_in_com_inertial;
  Position com_in_inertial;
  Transform aTStack_138 [8];
  undefined1 local_130 [16];
  double local_120;
  Position local_100 [24];
  KinDynComputations local_e8;
  Rotation local_d0 [72];
  Transform local_88 [96];
  
  computeRawMassMatrixAndTotalMomentum(this);
  getCenterOfMassPosition(&local_e8);
  iDynTree::Rotation::Identity();
  iDynTree::Position::operator-(local_100);
  iDynTree::Transform::Transform(local_88,local_d0,local_100);
  iDynTree::Transform::operator*(aTStack_138,(SpatialMomentum *)local_88);
  KinDynComputationsPrivateAttributes::getRobotLockedInertia(this->pimpl);
  dVar1 = (double)iDynTree::SpatialInertia::getMass();
  auVar2._8_8_ = dVar1;
  auVar2._0_8_ = dVar1;
  auVar2 = divpd(local_130,auVar2);
  *(undefined1 (*) [16])__return_storage_ptr__->m_data = auVar2;
  __return_storage_ptr__->m_data[2] = local_120 / dVar1;
  iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)aTStack_138);
  return __return_storage_ptr__;
}

Assistant:

Vector3 KinDynComputations::getCenterOfMassVelocity()
{
    this->computeRawMassMatrixAndTotalMomentum();

    // We exploit the structure of the cached total momentum to the the com velocity
    Position com_in_inertial = this->getCenterOfMassPosition();

    // Express the total momentum with the orientation of the inertial frame but in the center of mass
    SpatialMomentum m_totalMomentum_in_com_inertial = Transform(Rotation::Identity(),-com_in_inertial)*this->pimpl->m_totalMomentum;

    // The com velocity is just the linear part divided by the total mass
    double total_mass = pimpl->getRobotLockedInertia().getMass();

    Vector3 com_vel;
    toEigen(com_vel) = toEigen(m_totalMomentum_in_com_inertial.getLinearVec3())/total_mass;

    return com_vel;
}